

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O0

void __thiscall QStatusBar::removeWidget(QStatusBar *this,QWidget *widget)

{
  anon_class_8_1_722b4b82_for__M_pred pred;
  qsizetype qVar1;
  QList<QStatusBarPrivate::SBItem> *in_RSI;
  QStatusBarPrivate *d;
  QStatusBar *in_stack_00000098;
  
  if (in_RSI != (QList<QStatusBarPrivate::SBItem> *)0x0) {
    pred.widget = (QWidget *)d_func((QStatusBar *)0x6a3d1e);
    qVar1 = QList<QStatusBarPrivate::SBItem>::removeIf<QStatusBar::removeWidget(QWidget*)::__0>
                      (in_RSI,pred);
    if (qVar1 != 0) {
      QWidget::hide((QWidget *)0x6a3d53);
      reformat(in_stack_00000098);
    }
  }
  return;
}

Assistant:

void QStatusBar::removeWidget(QWidget *widget)
{
    if (!widget)
        return;

    Q_D(QStatusBar);
    if (d->items.removeIf([widget](const auto &item) { return item.widget == widget; })) {
        widget->hide();
        reformat();
    }
#if defined(QT_DEBUG)
    else
        qDebug("QStatusBar::removeWidget(): Widget not found.");
#endif
}